

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O3

void filemgr_clear_stale_list(filemgr *file)

{
  list_elem *__ptr;
  list_elem *e;
  
  if (file->stale_list != (list *)0x0) {
    e = file->stale_list->head;
    while (e != (list_elem *)0x0) {
      __ptr = e + -1;
      e = list_remove(file->stale_list,e);
      free(__ptr);
    }
    file->stale_list = (list *)0x0;
  }
  return;
}

Assistant:

void filemgr_clear_stale_list(struct filemgr *file)
{
    if (file->stale_list) {
        // if the items in the list are not freed yet, release them first.
        struct list_elem *e;
        struct stale_data *item;

        e = list_begin(file->stale_list);
        while (e) {
            item = _get_entry(e, struct stale_data, le);
            e = list_remove(file->stale_list, e);
            free(item);
        }
        file->stale_list = NULL;
    }
}